

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePicker::DateTimePicker(DateTimePicker *this,QTime *time,QWidget *parent)

{
  char cVar1;
  DateTimePickerPrivate *this_00;
  QSizePolicy type;
  code *local_40;
  undefined8 uStack_38;
  undefined1 local_30 [16];
  Connection local_20 [8];
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001a74f8;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_001a76a8;
  this_00 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(this_00,this,QTime);
  (this->d).d = this_00;
  type.field_0 = SUB84(this,0);
  QWidget::setSizePolicy(type);
  cVar1 = QTime::isValid();
  if (cVar1 == '\0') {
    QTime::QTime((QTime *)&local_40,0,0,0,0);
  }
  else {
    local_40 = (code *)CONCAT44(local_40._4_4_,time->mds);
  }
  setTime(this,(QTime *)&local_40);
  local_40 = _q_scrollAboutToStart;
  uStack_38 = 0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_20,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::aboutToStart,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection(local_20);
  local_40 = _q_scroll;
  uStack_38 = 0;
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::DateTimePicker::*)(int,int)>
            ((Object *)(local_30 + 8),(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::scroll,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)(local_30 + 8));
  local_40 = _q_scrollFinished;
  uStack_38 = 0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_30,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::finished,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( const QTime & time, QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, QMetaType::QTime ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	setTime( time.isValid() ? time : DATETIMEPICKER_TIME_MIN );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}